

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.h
# Opt level: O0

void __thiscall
Iir::PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter
          (PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> *this)

{
  CascadeStages<4,_Iir::DirectFormII> *in_RDI;
  Storage SVar1;
  LayoutBase *digitalStorage;
  LayoutBase *analogStorage;
  CascadeStages<4,_Iir::DirectFormII> *in_stack_ffffffffffffffb0;
  Storage local_18;
  
  ChebyshevI::LowPassBase::LowPassBase((LowPassBase *)0x103548);
  CascadeStages<4,_Iir::DirectFormII>::CascadeStages(in_stack_ffffffffffffffb0);
  digitalStorage = (LayoutBase *)&((PoleZeroPair *)in_RDI[1].m_stages)[1].zeros;
  memset(digitalStorage,0,0x100);
  Layout<8>::Layout((Layout<8> *)in_RDI);
  analogStorage = (LayoutBase *)&((PoleZeroPair *)in_RDI[2].m_stages)[1].zeros;
  memset(analogStorage,0,0x100);
  Layout<8>::Layout((Layout<8> *)in_RDI);
  SVar1 = CascadeStages<4,_Iir::DirectFormII>::getCascadeStorage
                    ((CascadeStages<4,_Iir::DirectFormII> *)0x1035b2);
  local_18.stageArray = SVar1.stageArray;
  local_18.maxStages = SVar1.maxStages;
  Cascade::setCascadeStorage((Cascade *)in_RDI,&local_18);
  Layout::operator_cast_to_LayoutBase((Layout<8> *)digitalStorage);
  Layout::operator_cast_to_LayoutBase((Layout<8> *)digitalStorage);
  PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>::setPrototypeStorage
            ((PoleFilterBase<Iir::ChebyshevI::AnalogLowPass> *)in_RDI,analogStorage,digitalStorage);
  CascadeStages<4,_Iir::DirectFormII>::reset(in_RDI);
  return;
}

Assistant:

PoleFilter ()
			{
				// This glues together the factored base classes
				// with the templatized storage classes.
				BaseClass::setCascadeStorage (this->getCascadeStorage());
				BaseClass::setPrototypeStorage (m_analogStorage, m_digitalStorage);
				CascadeStages<(MaxDigitalPoles + 1) / 2 , StateType>::reset();
			}